

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::yarn3>(yarn3 *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  string res;
  string local_58;
  double local_38;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  iVar1 = (r->P).a[0];
  iVar2 = (r->P).a[1];
  iVar3 = (r->P).a[2];
  uVar10 = (ulong)(uint)(r->S).r[0];
  iVar5 = 0;
  lVar8 = 0x1000000;
  iVar12 = (r->S).r[1];
  iVar13 = (r->S).r[2];
  do {
    iVar7 = iVar12;
    iVar12 = (int)uVar10;
    (r->S).r[2] = iVar7;
    uVar10 = (long)iVar13 * (long)iVar3 + (long)iVar7 * (long)iVar2 + (long)iVar12 * (long)iVar1;
    uVar10 = (uVar10 >> 0x1f) + (uVar10 & 0x7fffffff);
    uVar11 = uVar10 - 0xfffffffe;
    if (uVar10 < 0xfffffffe) {
      uVar11 = uVar10;
    }
    uVar10 = uVar11 + 0x80000001;
    if (uVar11 < 0x7fffffff) {
      uVar10 = uVar11;
    }
    (r->S).r[1] = iVar12;
    iVar13 = (int)uVar10;
    (r->S).r[0] = iVar13;
    uVar9 = 0;
    if (iVar13 != 0) {
      uVar9 = (uint)((ulong)*(uint *)(trng::yarn3::g + (uVar10 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn3::g + (long)(iVar13 >> 0x10) * 4 + 0x40000)) &
              0x7fffffff;
      iVar13 = (int)((ulong)*(uint *)(trng::yarn3::g + (uVar10 & 0xffff) * 4) *
                     (ulong)*(uint *)(trng::yarn3::g + (long)(iVar13 >> 0x10) * 4 + 0x40000) >> 0x1f
                    );
      uVar6 = uVar9 + iVar13;
      uVar9 = uVar9 + 0x80000001 + iVar13;
      if (uVar6 < 0x7fffffff) {
        uVar9 = uVar6;
      }
    }
    iVar5 = iVar5 + uVar9;
    lVar8 = lVar8 + -1;
    iVar13 = iVar7;
  } while (lVar8 != 0);
  lVar8 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar8 - lVar4) / 1000) * 1e-06);
  to_string<double>(&local_58,&local_38);
  while (local_58._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar5;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}